

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::
run_default_dispatcher_and_go_further(mt_env_infrastructure_t *this,env_init_t *init_fn)

{
  anon_class_40_2_424c5504 local_88;
  anon_class_8_1_8991fb9c local_60;
  anon_class_8_1_8991fb9c local_58 [3];
  allocator local_39;
  string local_38 [32];
  env_init_t *local_18;
  env_init_t *init_fn_local;
  mt_env_infrastructure_t *this_local;
  
  local_18 = init_fn;
  init_fn_local = (env_init_t *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"run_default_dispatcher",&local_39);
  local_88.this = this;
  local_60.this = this;
  local_58[0].this = this;
  std::function<void_()>::function(&local_88.init_fn,init_fn);
  so_5::impl::
  run_stage<so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_default_dispatcher_and_go_further(std::function<void()>)::__0,so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_default_dispatcher_and_go_further(std::function<void()>)::__1,so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::run_default_dispatcher_and_go_further(std::function<void()>)::__2>
            ((string *)local_38,local_58,&local_60,&local_88);
  run_default_dispatcher_and_go_further(std::function<void()>)::$_2::~__2((__2 *)&local_88);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void
mt_env_infrastructure_t::run_default_dispatcher_and_go_further(
	env_init_t init_fn )
	{
		::so_5::impl::run_stage(
				"run_default_dispatcher",
				[this] {
					m_default_dispatcher->set_data_sources_name_base( "DEFAULT" );
					m_default_dispatcher->start( m_env );
				},
				[this] {
					m_default_dispatcher->shutdown();
					m_default_dispatcher->wait();
				},
				[this, init_fn] {
					run_timer_thread_and_go_further( std::move(init_fn) );
				} );
	}